

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

quaternion * quaternion_get_rotation_tov3(vector3 *from,vector3 *to,quaternion *qR)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vector3 w;
  anon_union_24_3_07544b15_for_vector3_0 local_38;
  
  vector3_cross_product((vector3 *)&local_38.field_1,from,to);
  dVar3 = vector3_dot_product(from,to);
  (qR->field_0).q[0] = local_38.v[0];
  (qR->field_0).q[1] = local_38.v[1];
  (qR->field_0).q[2] = local_38.v[2];
  (qR->field_0).q[3] = dVar3;
  dVar4 = quaternion_norm(qR);
  (qR->field_0).q[3] = dVar3 + dVar4;
  dVar5 = -dVar4;
  if (-dVar4 <= dVar4) {
    dVar5 = dVar4;
  }
  if (1e-05 <= dVar5) {
    auVar2._8_8_ = local_38.v[1];
    auVar2._0_8_ = local_38.v[0];
    auVar6._8_8_ = dVar4;
    auVar6._0_8_ = dVar4;
    auVar6 = divpd(auVar2,auVar6);
    *(undefined1 (*) [16])&qR->field_0 = auVar6;
    auVar7._8_8_ = dVar3 + dVar4;
    auVar7._0_8_ = local_38.v[2];
    auVar1._8_8_ = dVar4;
    auVar1._0_8_ = dVar4;
    auVar6 = divpd(auVar7,auVar1);
    *(undefined1 (*) [16])((long)&qR->field_0 + 0x10) = auVar6;
  }
  return qR;
}

Assistant:

HYPAPI struct quaternion *quaternion_get_rotation_tov3(const struct vector3 *from, const struct vector3 *to, struct quaternion *qR)
{
	/* this code avoids sqrt and cos and sin and would be nice to
	 * avoid division
	 */
	struct vector3 w;
	HYP_FLOAT dot;
	HYP_FLOAT norm;

	vector3_cross_product(&w, from, to);
	dot = vector3_dot_product(from, to);

	qR->x = w.x;
	qR->y = w.y;
	qR->z = w.z;
	qR->w = dot;

	norm = quaternion_norm(qR);
	qR->w += norm;

	/* normalization with avoidance of div/0 and reusing the norm */
	/* (already calculated above) */
	if (!scalar_equalsf(norm, 0.0f)) {
		qR->x /= norm;
		qR->y /= norm;
		qR->z /= norm;
		qR->w /= norm;
	}

	return qR;
}